

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_composite_constants(CompilerHLSL *this)

{
  anon_class_16_2_6cfede0d local_28;
  bool local_11;
  CompilerHLSL *pCStack_10;
  bool emitted;
  CompilerHLSL *this_local;
  
  local_11 = false;
  local_28.emitted = &local_11;
  local_28.this = this;
  pCStack_10 = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRConstant,spirv_cross::CompilerHLSL::emit_composite_constants()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_28);
  if ((local_11 & 1U) != 0) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_composite_constants()
{
	// HLSL cannot declare structs or arrays inline, so we must move them out to
	// global constants directly.
	bool emitted = false;

	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		if (c.specialization)
			return;

		auto &type = this->get<SPIRType>(c.constant_type);
		if (type.basetype == SPIRType::Struct || !type.array.empty())
		{
			auto name = to_name(c.self);
			statement("static const ", variable_decl(type, name), " = ", constant_expression(c), ";");
			emitted = true;
		}
	});

	if (emitted)
		statement("");
}